

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

QPDF_ERROR_CODE qpdf_c_wrap(qpdf_data qpdf,function<void_()> *fn)

{
  QPDF_ERROR_CODE QVar1;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1972:30)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1972:30)>
             ::_M_manager;
  local_28._M_unused._M_object = fn;
  QVar1 = trap_errors(qpdf,(function<void_(_qpdf_data_*)> *)&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return QVar1;
}

Assistant:

QPDF_ERROR_CODE
qpdf_c_wrap(qpdf_data qpdf, std::function<void()> fn)
{
    return trap_errors(qpdf, [&fn](qpdf_data) { fn(); });
}